

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O1

void riscv_cpu_do_interrupt_riscv64(CPUState *cs)

{
  uint uVar1;
  char cVar2;
  ulong uVar3;
  TranslationBlock *pTVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  TranslationBlock **ppTVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  TranslationBlock *pTVar15;
  TranslationBlock *pTVar16;
  ulong uVar17;
  
  cVar2 = (char)cs[1].tb_jmp_cache[0x18a];
  if (cVar2 < '\0') {
    bVar7 = *(byte *)(cs[1].tb_jmp_cache + 0x18e) >> 1;
  }
  else {
    bVar7 = 0;
  }
  uVar1 = cs->exception_index;
  uVar5 = uVar1 & 0x7fffffff;
  ppTVar10 = cs[1].tb_jmp_cache + 0x19a;
  if ((int)uVar1 < 0) {
    ppTVar10 = cs[1].tb_jmp_cache + 0x195;
  }
  if ((int)uVar1 < 0) {
    pTVar15 = (TranslationBlock *)0x0;
  }
  else {
    pTVar15 = (TranslationBlock *)0x0;
    if (uVar5 < 0x18) {
      if ((0xb0f3U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0xb00000U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00c7363f;
        bVar7 = 1;
      }
      pTVar15 = cs[1].tb_jmp_cache[0x187];
    }
LAB_00c7363f:
    if (uVar5 == 8) {
      pTVar16 = cs[1].tb_jmp_cache[0x18d];
      if ((TranslationBlock *)0x3 < pTVar16) {
        __assert_fail("env->priv <= 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                      ,0x35d,"void riscv_cpu_do_interrupt_riscv64(CPUState *)");
      }
      if (pTVar16 == (TranslationBlock *)0x3) {
        uVar5 = 0xb;
      }
      else if ((pTVar16 != (TranslationBlock *)&DAT_00000001) ||
              ((((-1 < cVar2 || (uVar5 = 10, ((ulong)cs[1].tb_jmp_cache[0x18e] & 1) == 0)) &&
                (uVar5 = 9, cVar2 < '\0')) && (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0)))) {
        uVar5 = 8;
      }
    }
  }
  uVar17 = (ulong)uVar5;
  if (((0x3f < uVar5) || ((TranslationBlock *)&DAT_00000001 < cs[1].tb_jmp_cache[0x18d])) ||
     (((ulong)*ppTVar10 >> (uVar17 & 0x3f) & 1) == 0)) {
    if (cVar2 < '\0') {
      if ((cVar2 < '\0') && (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0)) {
        riscv_cpu_swap_hypervisor_regs_riscv64
                  ((CPURISCVState_conflict1 *)(cs[1].tb_jmp_cache + 0x143));
      }
      pTVar16 = cs[1].tb_jmp_cache[0x191];
      cVar2 = (char)cs[1].tb_jmp_cache[0x18a];
      if (cVar2 < '\0') {
        uVar9 = (ulong)((uint)cs[1].tb_jmp_cache[0x18e] & 1) << 0x27;
      }
      else {
        uVar9 = 0;
      }
      cs[1].tb_jmp_cache[0x191] = (TranslationBlock *)(uVar9 | (ulong)pTVar16 & 0xffffff7fffffffff);
      if (cVar2 < '\0') {
        uVar8 = (ulong)((uint)cs[1].tb_jmp_cache[0x18e] & 2) << 0x25;
      }
      else {
        uVar8 = 0;
      }
      cs[1].tb_jmp_cache[0x191] =
           (TranslationBlock *)(uVar8 | uVar9 | (ulong)pTVar16 & 0xffffff3fffffffff);
      pTVar16 = cs[1].tb_jmp_cache[0x188];
      if (cVar2 < '\0') {
        if (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0) {
          tlb_flush_riscv64(cs);
        }
        *(byte *)(cs[1].tb_jmp_cache + 0x18e) = *(byte *)(cs[1].tb_jmp_cache + 0x18e) & 0xfe;
      }
      if (((ulong)cs[1].tb_jmp_cache[0x18a] & 0x80) != 0) {
        *(byte *)(cs[1].tb_jmp_cache + 0x18e) = *(byte *)(cs[1].tb_jmp_cache + 0x18e) & 0xfd;
      }
    }
    else {
      pTVar16 = (TranslationBlock *)0x0;
    }
    pTVar4 = cs[1].tb_jmp_cache[0x191];
    if (cs[1].tb_jmp_cache[0x189] < (TranslationBlock *)0x11000) {
      uVar5 = 1 << (*(byte *)(cs[1].tb_jmp_cache + 0x18d) & 0x1f);
      uVar5 = (uint)(((ulong)pTVar4 & (long)(int)uVar5) /
                    (ulong)(long)(int)(uVar5 & ~(2 << (*(byte *)(cs[1].tb_jmp_cache + 0x18d) & 0x1f)
                                                )));
    }
    else {
      uVar5 = (uint)((ulong)pTVar4 >> 3);
    }
    cs[1].tb_jmp_cache[0x191] =
         (TranslationBlock *)
         ((ulong)pTVar4 & 0xffffffffffffe777 |
          (ulong)((*(uint *)(cs[1].tb_jmp_cache + 0x18d) & 3) << 0xb) | (ulong)((uVar5 & 1) << 7));
    uVar9 = ~(0xffffffffffffffffU >> (byte)(uVar1 >> 0x1f)) | uVar17;
    pTVar4 = (TranslationBlock *)0x3;
    lVar6 = 0x8fe8;
    lVar11 = 0x9080;
    lVar12 = 0x8fc0;
    lVar13 = 0x8ff0;
    lVar14 = 0x8ff8;
    goto LAB_00c73956;
  }
  if (cVar2 < '\0') {
    if (cVar2 < '\0') {
      if (((((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0) &&
          ((1L << ((byte)uVar5 & 0x3f) & (ulong)cs[1].tb_jmp_cache[(ulong)(uVar1 >> 0x1f) + 0x1a3])
           != 0)) && ((bVar7 & 1) == 0)) {
        uVar17 = uVar17 - (uVar17 == 10 || (uVar5 & 0x3b) == 2);
        goto LAB_00c736cf;
      }
      if ((-1 < cVar2) || (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) == 0)) goto LAB_00c73863;
      riscv_cpu_swap_hypervisor_regs_riscv64
                ((CPURISCVState_conflict1 *)(cs[1].tb_jmp_cache + 0x143));
      uVar9 = ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffcff) +
              (ulong)((uint)cs[1].tb_jmp_cache[0x1a2] & 0x80) * 4;
      pTVar16 = cs[1].tb_jmp_cache[0x18a];
      uVar8 = (ulong)((uint)cs[1].tb_jmp_cache[0x191] & 0x100);
      cs[1].tb_jmp_cache[0x1a2] = (TranslationBlock *)(uVar8 | uVar9);
      cVar2 = (char)pTVar16;
      if (cVar2 < '\0') {
        uVar3 = (ulong)((*(uint *)(cs[1].tb_jmp_cache + 0x18e) & 1) << 7);
      }
      else {
        uVar3 = 0;
      }
      cs[1].tb_jmp_cache[0x1a2] = (TranslationBlock *)(uVar3 | uVar8 | uVar9 & 0xffffffffffffff7f);
      pTVar16 = cs[1].tb_jmp_cache[0x188];
      if (cVar2 < '\0') {
        if (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0) {
          tlb_flush_riscv64(cs);
        }
        *(byte *)(cs[1].tb_jmp_cache + 0x18e) = *(byte *)(cs[1].tb_jmp_cache + 0x18e) & 0xfe;
      }
      if (((ulong)cs[1].tb_jmp_cache[0x18a] & 0x80) != 0) {
        *(byte *)(cs[1].tb_jmp_cache + 0x18e) = *(byte *)(cs[1].tb_jmp_cache + 0x18e) & 0xfd;
      }
    }
    else {
LAB_00c73863:
      uVar9 = ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffcff) +
              (ulong)((uint)cs[1].tb_jmp_cache[0x1a2] & 0x80) * 4;
      uVar8 = (ulong)((uint)cs[1].tb_jmp_cache[0x191] & 0x100);
      cs[1].tb_jmp_cache[0x1a2] = (TranslationBlock *)(uVar8 | uVar9);
      if (cVar2 < '\0') {
        uVar3 = (ulong)((*(uint *)(cs[1].tb_jmp_cache + 0x18e) & 1) << 7);
      }
      else {
        uVar3 = 0;
      }
      cs[1].tb_jmp_cache[0x1a2] = (TranslationBlock *)(uVar3 | uVar8 | uVar9 & 0xffffffffffffff7f);
      pTVar16 = cs[1].tb_jmp_cache[0x188];
    }
  }
  else {
LAB_00c736cf:
    pTVar16 = (TranslationBlock *)0x0;
  }
  pTVar4 = cs[1].tb_jmp_cache[0x191];
  if (cs[1].tb_jmp_cache[0x189] < (TranslationBlock *)0x11000) {
    uVar5 = 1 << (*(byte *)(cs[1].tb_jmp_cache + 0x18d) & 0x1f);
    uVar5 = (uint)(((ulong)pTVar4 & (long)(int)uVar5) /
                  (ulong)(long)(int)(uVar5 & ~(2 << (*(byte *)(cs[1].tb_jmp_cache + 0x18d) & 0x1f)))
                  );
  }
  else {
    uVar5 = (uint)((ulong)pTVar4 >> 1);
  }
  cs[1].tb_jmp_cache[0x191] =
       (TranslationBlock *)
       ((ulong)pTVar4 & 0xfffffffffffffedd |
        (ulong)((*(uint *)(cs[1].tb_jmp_cache + 0x18d) & 1) << 8) | (ulong)((uVar5 & 1) << 5));
  uVar9 = (ulong)(uVar1 >> 0x1f) << 0x3f | uVar17;
  pTVar4 = (TranslationBlock *)&DAT_00000001;
  lVar6 = 0x8fd0;
  lVar11 = 0x9028;
  lVar12 = 0x8fb8;
  lVar13 = 0x8fd8;
  lVar14 = 0x8fe0;
LAB_00c73956:
  *(ulong *)((long)cs->jmp_env[0].__jmpbuf + lVar14 + -0x40) = uVar9;
  *(TranslationBlock **)((long)cs->jmp_env[0].__jmpbuf + lVar13 + -0x40) = cs[1].tb_jmp_cache[0x183]
  ;
  *(TranslationBlock **)((long)cs->jmp_env[0].__jmpbuf + lVar12 + -0x40) = pTVar15;
  *(TranslationBlock **)((long)cs->jmp_env[0].__jmpbuf + lVar11 + -0x40) = pTVar16;
  uVar9 = *(ulong *)((long)cs->jmp_env[0].__jmpbuf + lVar6 + -0x40);
  lVar6 = uVar17 << 2;
  if (((uint)uVar9 & 3) != 1) {
    lVar6 = 0;
  }
  if (-1 < (int)uVar1) {
    lVar6 = 0;
  }
  cs[1].tb_jmp_cache[0x183] = (TranslationBlock *)(lVar6 + (uVar9 & 0xfffffffffffffffc));
  cs[1].tb_jmp_cache[0x18d] = pTVar4;
  cs[1].tb_jmp_cache[0x184] = (TranslationBlock *)0xffffffffffffffff;
  cs->exception_index = -1;
  return;
}

Assistant:

void riscv_cpu_do_interrupt(CPUState *cs)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    bool force_hs_execp = riscv_cpu_force_hs_excep_enabled(env);
    target_ulong s;

    /* cs->exception is 32-bits wide unlike mcause which is XLEN-bits wide
     * so we mask off the MSB and separate into trap type and cause.
     */
    bool async = !!(cs->exception_index & RISCV_EXCP_INT_FLAG);
    target_ulong cause = cs->exception_index & RISCV_EXCP_INT_MASK;
    target_ulong deleg = async ? env->mideleg : env->medeleg;
    target_ulong tval = 0;
    target_ulong htval = 0;
    target_ulong mtval2 = 0;

    if (!async) {
        /* set tval to badaddr for traps with address information */
        switch (cause) {
        case RISCV_EXCP_INST_GUEST_PAGE_FAULT:
        case RISCV_EXCP_LOAD_GUEST_ACCESS_FAULT:
        case RISCV_EXCP_STORE_GUEST_AMO_ACCESS_FAULT:
            force_hs_execp = true;
            /* fallthrough */
        case RISCV_EXCP_INST_ADDR_MIS:
        case RISCV_EXCP_INST_ACCESS_FAULT:
        case RISCV_EXCP_LOAD_ADDR_MIS:
        case RISCV_EXCP_STORE_AMO_ADDR_MIS:
        case RISCV_EXCP_LOAD_ACCESS_FAULT:
        case RISCV_EXCP_STORE_AMO_ACCESS_FAULT:
        case RISCV_EXCP_INST_PAGE_FAULT:
        case RISCV_EXCP_LOAD_PAGE_FAULT:
        case RISCV_EXCP_STORE_PAGE_FAULT:
            tval = env->badaddr;
            break;
        default:
            break;
        }
        /* ecall is dispatched as one cause so translate based on mode */
        if (cause == RISCV_EXCP_U_ECALL) {
            assert(env->priv <= 3);

            if (env->priv == PRV_M) {
                cause = RISCV_EXCP_M_ECALL;
            } else if (env->priv == PRV_S && riscv_cpu_virt_enabled(env)) {
                cause = RISCV_EXCP_VS_ECALL;
            } else if (env->priv == PRV_S && !riscv_cpu_virt_enabled(env)) {
                cause = RISCV_EXCP_S_ECALL;
            } else if (env->priv == PRV_U) {
                cause = RISCV_EXCP_U_ECALL;
            }
        }
    }

    if (env->priv <= PRV_S &&
            cause < TARGET_LONG_BITS && ((deleg >> cause) & 1)) {
        /* handle the trap in S-mode */
        if (riscv_has_ext(env, RVH)) {
            target_ulong hdeleg = async ? env->hideleg : env->hedeleg;

            if (riscv_cpu_virt_enabled(env) && ((hdeleg >> cause) & 1) &&
                !force_hs_execp) {
                /*
                 * See if we need to adjust cause. Yes if its VS mode interrupt
                 * no if hypervisor has delegated one of hs mode's interrupt
                 */
                if (cause == IRQ_VS_TIMER || cause == IRQ_VS_SOFT ||
                    cause == IRQ_VS_EXT)
                    cause = cause - 1;
                /* Trap to VS mode */
            } else if (riscv_cpu_virt_enabled(env)) {
                /* Trap into HS mode, from virt */
                riscv_cpu_swap_hypervisor_regs(env);
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2V,
                                         get_field(env->hstatus, HSTATUS_SPV));
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2P,
                                         get_field(env->mstatus, SSTATUS_SPP));
                env->hstatus = set_field(env->hstatus, HSTATUS_SPV,
                                         riscv_cpu_virt_enabled(env));

                htval = env->guest_phys_fault_addr;

                riscv_cpu_set_virt_enabled(env, 0);
                riscv_cpu_set_force_hs_excep(env, 0);
            } else {
                /* Trap into HS mode */
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2V,
                                         get_field(env->hstatus, HSTATUS_SPV));
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2P,
                                         get_field(env->mstatus, SSTATUS_SPP));
                env->hstatus = set_field(env->hstatus, HSTATUS_SPV,
                                         riscv_cpu_virt_enabled(env));

                htval = env->guest_phys_fault_addr;
            }
        }

        s = env->mstatus;
        s = set_field(s, MSTATUS_SPIE, env->priv_ver >= PRIV_VERSION_1_10_0 ?
            get_field(s, MSTATUS_SIE) : get_field(s, MSTATUS_UIE << env->priv));
        s = set_field(s, MSTATUS_SPP, env->priv);
        s = set_field(s, MSTATUS_SIE, 0);
        env->mstatus = s;
        env->scause = cause | ((target_ulong)async << (TARGET_LONG_BITS - 1));
        env->sepc = env->pc;
        env->sbadaddr = tval;
        env->htval = htval;
        env->pc = (env->stvec >> 2 << 2) +
            ((async && (env->stvec & 3) == 1) ? cause * 4 : 0);
        riscv_cpu_set_mode(env, PRV_S);
    } else {
        /* handle the trap in M-mode */
        if (riscv_has_ext(env, RVH)) {
            if (riscv_cpu_virt_enabled(env)) {
                riscv_cpu_swap_hypervisor_regs(env);
            }
#ifdef TARGET_RISCV32
            env->mstatush = set_field(env->mstatush, MSTATUS_MPV,
                                       riscv_cpu_virt_enabled(env));
            env->mstatush = set_field(env->mstatush, MSTATUS_MTL,
                                       riscv_cpu_force_hs_excep_enabled(env));
#else
            env->mstatus = set_field(env->mstatus, MSTATUS_MPV,
                                      riscv_cpu_virt_enabled(env));
            env->mstatus = set_field(env->mstatus, MSTATUS_MTL,
                                      riscv_cpu_force_hs_excep_enabled(env));
#endif

            mtval2 = env->guest_phys_fault_addr;

            /* Trapping to M mode, virt is disabled */
            riscv_cpu_set_virt_enabled(env, 0);
            riscv_cpu_set_force_hs_excep(env, 0);
        }

        s = env->mstatus;
        s = set_field(s, MSTATUS_MPIE, env->priv_ver >= PRIV_VERSION_1_10_0 ?
            get_field(s, MSTATUS_MIE) : get_field(s, MSTATUS_UIE << env->priv));
        s = set_field(s, MSTATUS_MPP, env->priv);
        s = set_field(s, MSTATUS_MIE, 0);
        env->mstatus = s;
        env->mcause = cause | ~(((target_ulong)-1) >> async);
        env->mepc = env->pc;
        env->mbadaddr = tval;
        env->mtval2 = mtval2;
        env->pc = (env->mtvec >> 2 << 2) +
            ((async && (env->mtvec & 3) == 1) ? cause * 4 : 0);
        riscv_cpu_set_mode(env, PRV_M);
    }

    /* NOTE: it is not necessary to yield load reservations here. It is only
     * necessary for an SC from "another hart" to cause a load reservation
     * to be yielded. Refer to the memory consistency model section of the
     * RISC-V ISA Specification.
     */

    cs->exception_index = EXCP_NONE; /* mark handled to qemu */
}